

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O2

int Aig_ManLevels(Aig_Man_t *p)

{
  uint uVar1;
  void *pvVar2;
  int i;
  uint uVar3;
  
  uVar3 = 0;
  for (i = 0; i < p->vCos->nSize; i = i + 1) {
    pvVar2 = Vec_PtrEntry(p->vCos,i);
    uVar1 = *(uint *)((*(ulong *)((long)pvVar2 + 8) & 0xfffffffffffffffe) + 0x1c) & 0xffffff;
    if (uVar3 <= uVar1) {
      uVar3 = uVar1;
    }
  }
  return uVar3;
}

Assistant:

int Aig_ManLevels( Aig_Man_t * p )
{
    Aig_Obj_t * pObj;
    int i, LevelMax = 0;
    Aig_ManForEachCo( p, pObj, i )
        LevelMax = Abc_MaxInt( LevelMax, (int)Aig_ObjFanin0(pObj)->Level );
    return LevelMax;
}